

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-accesses.cpp
# Opt level: O3

size_t test_memory(vector<int_*,_std::allocator<int_*>_> *memory)

{
  pointer ppiVar1;
  pointer ppiVar2;
  ostream *poVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  
  ppiVar1 = (memory->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppiVar2 = (memory->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar7 = (long)ppiVar2 - (long)ppiVar1 >> 3;
  std::chrono::_V2::steady_clock::now();
  iVar4 = 0;
  sVar6 = 0;
  do {
    if (ppiVar2 != ppiVar1) {
      lVar5 = 0;
      do {
        sVar6 = sVar6 + (long)*(memory->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
                               super__Vector_impl_data._M_start[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar5);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x32);
  std::chrono::_V2::steady_clock::now();
  poVar3 = std::ostream::_M_insert<long>((long)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return sVar6;
}

Assistant:

size_t test_memory(const std::vector<Type*>& memory)
{
    size_t sum = 0;
    size_t size = memory.size();

    using Clock = std::chrono::steady_clock;
    auto start = Clock::now();

    for (int i = 0; i < REPETITIONS; i++)
    {
        for (size_t j = 0; j < size; j++)
        {
            sum += *memory[j];
        }
    }

    std::cerr << std::chrono::duration_cast<std::chrono::microseconds>(Clock::now() - start).count() << std::endl;
    return sum;
}